

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_580a1::MapDrivePlugIn::regenerateMap(MapDrivePlugIn *this)

{
  PolylineSegmentedPathwaySegmentRadii *this_00;
  int iVar1;
  undefined4 extraout_var;
  GCRoute *path;
  int i;
  int iVar2;
  size_type segmentIndex;
  int j_2;
  int iVar3;
  size_type segmentIndex_00;
  TerrainMap *pTVar4;
  size_type segmentIndex_01;
  int j;
  int iVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pTVar4 = this->vehicle->map;
  iVar1 = pTVar4->resolution;
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      TerrainMap::setMapBit(pTVar4,iVar2,iVar5,false);
      iVar1 = pTVar4->resolution;
    }
  }
  pTVar4 = this->vehicle->map;
  if (this->useRandomRocks == true) {
    iVar1 = pTVar4->resolution;
    fVar7 = OpenSteer::frandom01();
    iVar2 = (int)(fVar7 * 100.0 + 50.0);
    fVar7 = (float)(iVar1 + -4);
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (iVar1 = 0; iVar1 != iVar2; iVar1 = iVar1 + 1) {
      fVar8 = OpenSteer::frandom01();
      fVar9 = OpenSteer::frandom01();
      fVar10 = OpenSteer::frandom01();
      iVar5 = (int)(fVar10 * 10.0 + 0.0);
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        fVar10 = OpenSteer::frandom01();
        fVar11 = OpenSteer::frandom01();
        TerrainMap::setMapBit
                  (pTVar4,(int)(fVar10 * 4.0 + 0.0) + (int)(fVar8 * fVar7 + 0.0),
                   (int)(fVar11 * 4.0 + 0.0) + (int)(fVar9 * fVar7 + 0.0),true);
      }
    }
    pTVar4 = this->vehicle->map;
  }
  iVar1 = pTVar4->resolution;
  iVar2 = (iVar1 >> 4) + iVar1 >> 1;
  iVar5 = iVar1 - (iVar1 >> 4) >> 1;
  for (iVar1 = iVar5; iVar3 = iVar5, iVar1 <= iVar2; iVar1 = iVar1 + 1) {
    for (; iVar3 <= iVar2; iVar3 = iVar3 + 1) {
      TerrainMap::setMapBit(pTVar4,iVar1,iVar3,false);
    }
  }
  if ((anonymous_namespace)::MapDriver::demoSelect < 2) {
    pTVar4 = this->vehicle->map;
    iVar1 = pTVar4->resolution;
    iVar5 = 0;
    iVar2 = 0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    for (; iVar5 != iVar2; iVar5 = iVar5 + 1) {
      for (iVar3 = 0; iVar3 != iVar1; iVar3 = iVar3 + 1) {
        if (((((iVar5 == 0) || (iVar3 == 0)) || (iVar5 == iVar1 + -1)) || (-iVar1 + iVar3 == -1)) ||
           ((((iVar1 >> 4) + iVar1 >> 1 < iVar5 || iVar5 < iVar1 - (iVar1 >> 4) >> 1) &&
             (iVar5 < iVar1 - (iVar1 >> 3) && iVar1 >> 3 < iVar5) &&
            ((iVar5 == iVar3 || (iVar5 + -iVar1 + iVar3 == -1)))))) {
          TerrainMap::setMapBit(pTVar4,iVar5,iVar3,true);
        }
      }
    }
  }
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    iVar2 = (*(this->vehicle->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])();
    iVar1 = this->vehicle->pathFollowDirection;
    segmentIndex_01 = CONCAT44(extraout_var,iVar2) - 1;
    segmentIndex_00 = 0;
    segmentIndex = 0;
    if (0 < iVar1) {
      segmentIndex = segmentIndex_01;
    }
    fVar7 = OpenSteer::PolylineSegmentedPathwaySegmentRadii::segmentRadius
                      (this->vehicle->path,segmentIndex);
    for (; CONCAT44(extraout_var,iVar2) != segmentIndex_00; segmentIndex_00 = segmentIndex_00 + 1) {
      this_00 = this->vehicle->path;
      fVar8 = OpenSteer::frandom01();
      OpenSteer::PolylineSegmentedPathwaySegmentRadii::setSegmentRadius
                (this_00,segmentIndex_00,fVar8 * 15.0 + 4.0);
    }
    if (0 < iVar1) {
      segmentIndex_01 = 0;
    }
    OpenSteer::PolylineSegmentedPathwaySegmentRadii::setSegmentRadius
              (this->vehicle->path,segmentIndex_01,fVar7);
    if ((this->usePathFences == true) && ((anonymous_namespace)::MapDriver::demoSelect == 2)) {
      drawPathFencesOnMap((MapDrivePlugIn *)this->vehicle->map,(TerrainMap *)this->vehicle->path,
                          path);
      return;
    }
  }
  return;
}

Assistant:

void regenerateMap (void)
	{
	    // regenerate map: clear and add random "rocks"
	    vehicle->map->clear();
	    drawRandomClumpsOfRocksOnMap (*vehicle->map);
	    clearCenterOfMap (*vehicle->map);

	    // draw fences for first two demo modes
	    if (vehicle->demoSelect < 2) drawBoundaryFencesOnMap (*vehicle->map);

	    // randomize path widths
	    if (vehicle->demoSelect == 2)
	    {
		const OpenSteer::size_t count = vehicle->path->segmentCount();
		const bool upstream = vehicle->pathFollowDirection > 0;
		const OpenSteer::size_t entryIndex = upstream ? 0 : count-1;
		const OpenSteer::size_t exitIndex  = upstream ? count-1 : 0;
		const float lastExitRadius = vehicle->path->segmentRadius( exitIndex );
		for (OpenSteer::size_t i = 0; i < count; i++)
		{
		    vehicle->path->setSegmentRadius( i, frandom2 (4, 19) );
		}
		vehicle->path->setSegmentRadius( entryIndex, lastExitRadius );
	    }

	    // mark path-boundary map cells as obstacles
	    // (when in path following demo and appropriate mode is set)
	    if (usePathFences && (vehicle->demoSelect == 2))
		drawPathFencesOnMap (*vehicle->map, *vehicle->path);
	}